

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_type_lookupSlot(sysbvm_context_t *context,sysbvm_tuple_t type,sysbvm_tuple_t slotName)

{
  sysbvm_tuple_t context_00;
  _Bool _Var1;
  sysbvm_tuple_t type_00;
  sysbvm_context_t *local_38;
  sysbvm_tuple_t found;
  sysbvm_tuple_t slotDictionary;
  sysbvm_tuple_t slotName_local;
  sysbvm_tuple_t type_local;
  sysbvm_context_t *context_local;
  
  slotDictionary = slotName;
  slotName_local = type;
  type_local = (sysbvm_tuple_t)context;
  _Var1 = sysbvm_tuple_isNonNullPointer(type);
  if (_Var1) {
    _Var1 = sysbvm_tuple_isDummyValue(slotName_local);
    if (_Var1) {
      context_local = (sysbvm_context_t *)0x0;
    }
    else {
      found = sysbvm_type_getSlotDictionary(slotName_local);
      if (found != 0) {
        local_38 = (sysbvm_context_t *)0x0;
        _Var1 = sysbvm_methodDictionary_find(found,slotDictionary,(sysbvm_tuple_t *)&local_38);
        if (_Var1) {
          return (sysbvm_tuple_t)local_38;
        }
      }
      context_00 = type_local;
      type_00 = sysbvm_type_getSupertype(slotName_local);
      context_local =
           (sysbvm_context_t *)
           sysbvm_type_lookupSlot((sysbvm_context_t *)context_00,type_00,slotDictionary);
    }
  }
  else {
    context_local = (sysbvm_context_t *)0x0;
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_lookupSlot(sysbvm_context_t *context, sysbvm_tuple_t type, sysbvm_tuple_t slotName)
{
    if(!sysbvm_tuple_isNonNullPointer(type)) return SYSBVM_NULL_TUPLE;
    if(sysbvm_tuple_isDummyValue(type)) return SYSBVM_NULL_TUPLE;

    sysbvm_tuple_t slotDictionary = sysbvm_type_getSlotDictionary(type);
    if(slotDictionary)
    {
        sysbvm_tuple_t found = SYSBVM_NULL_TUPLE;
        if(sysbvm_methodDictionary_find(slotDictionary, slotName, &found))
            return found;
    }

    return sysbvm_type_lookupSlot(context, sysbvm_type_getSupertype(type), slotName);
}